

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool PairSearchHelperBoolTolerance
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBoolTolerance *a_result)

{
  ON_RTreeBranch *a_rectB;
  int iVar1;
  bool bVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar3;
  
  iVar1 = a_nodeB->m_count;
  for (paVar3 = &a_nodeB->m_branch[0].field_1; a_rectB = (ON_RTreeBranch *)(paVar3 + -6),
      a_rectB < a_nodeB->m_branch + iVar1; paVar3 = paVar3 + 7) {
    bVar2 = PairSearchOverlapHelper
                      (&a_branchA->m_rect,(ON_RTreeBBox *)a_rectB,a_result->m_tolerance);
    if (bVar2) {
      if (a_nodeB->m_level < 1) {
        bVar2 = (*a_result->m_resultCallbackBoolTolerance)
                          (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                           (ON__INT_PTR)paVar3->m_child,&a_result->m_tolerance);
      }
      else {
        bVar2 = PairSearchHelperBoolTolerance(a_branchA,paVar3->m_child,a_result);
      }
      if (bVar2 == false) break;
    }
  }
  return a_nodeB->m_branch + iVar1 <= a_rectB;
}

Assistant:

static bool PairSearchHelperBoolTolerance(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBoolTolerance* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;
  while (branchB < branchBmax)
  {
    if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
    {
      if (a_nodeB->m_level > 0)
      {
        if (!PairSearchHelperBoolTolerance(a_branchA, branchB->m_child, a_result))
          return false;
      }
      else
      {
        if (!a_result->m_resultCallbackBoolTolerance(a_result->m_context, a_branchA->m_id, branchB->m_id, &a_result->m_tolerance))
          return false;
      }
    }
    branchB++;
  }
  return true;
}